

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_quaternion rf_quaternion_invert(rf_quaternion q)

{
  rf_quaternion rVar1;
  float fVar2;
  float i;
  float lengthSq;
  float length;
  rf_quaternion q_local;
  rf_quaternion result;
  
  q_local.z = q.x;
  q_local.w = q.y;
  result.x = q.z;
  result.y = q.w;
  fVar2 = rf_quaternion_len(q);
  fVar2 = fVar2 * fVar2;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = 1.0 / fVar2;
    q_local.z = -fVar2 * q_local.z;
    q_local.w = -fVar2 * q_local.w;
    result.x = -fVar2 * result.x;
    result.y = fVar2 * result.y;
  }
  rVar1.y = q_local.w;
  rVar1.x = q_local.z;
  rVar1.z = result.x;
  rVar1.w = result.y;
  return rVar1;
}

Assistant:

RF_API rf_quaternion rf_quaternion_invert(rf_quaternion q)
{
    rf_quaternion result = q;
    float length = rf_quaternion_len(q);
    float lengthSq = length * length;

    if (lengthSq != 0.0)
    {
        float i = 1.0f / lengthSq;

        result.x *= -i;
        result.y *= -i;
        result.z *= -i;
        result.w *= i;
    }

    return result;
}